

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchChoice.c
# Opt level: O3

int Aig_ManCheckAcyclic(Aig_Man_t *p,int fVerbose)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Aig_Obj_t *pNode;
  Aig_Man_t *pAVar3;
  ulong uVar4;
  
  Aig_ManIncrementTravId(p);
  Aig_ManIncrementTravId(p);
  pVVar2 = p->vCos;
  if (0 < pVVar2->nSize) {
    uVar4 = 0;
    do {
      pNode = (Aig_Obj_t *)(*(ulong *)((long)pVVar2->pArray[uVar4] + 8) & 0xfffffffffffffffe);
      if (p->nTravIds + -1 != pNode->TravId) {
        pAVar3 = p;
        iVar1 = Aig_ManCheckAcyclic_rec(p,pNode,fVerbose);
        if (iVar1 == 0) {
          if (fVerbose != 0) {
            Abc_Print((int)pAVar3," CO %d\n",uVar4 & 0xffffffff);
            return 0;
          }
          return 0;
        }
        pVVar2 = p->vCos;
      }
      uVar4 = uVar4 + 1;
    } while ((long)uVar4 < (long)pVVar2->nSize);
  }
  return 1;
}

Assistant:

int Aig_ManCheckAcyclic( Aig_Man_t * p, int fVerbose )
{
    Aig_Obj_t * pNode;
    int fAcyclic;
    int i;
    // set the traversal ID for this DFS ordering
    Aig_ManIncrementTravId( p );   
    Aig_ManIncrementTravId( p );   
    // pNode->TravId == pNet->nTravIds      means "pNode is on the path"
    // pNode->TravId == pNet->nTravIds - 1  means "pNode is visited but is not on the path"
    // pNode->TravId <  pNet->nTravIds - 1  means "pNode is not visited"
    // traverse the network to detect cycles
    fAcyclic = 1;
    Aig_ManForEachCo( p, pNode, i )
    {
        pNode = Aig_ObjFanin0(pNode);
        if ( Aig_ObjIsTravIdPrevious(p, pNode) )
            continue;
        // traverse the output logic cone
        if ( (fAcyclic = Aig_ManCheckAcyclic_rec(p, pNode, fVerbose)) )
            continue;
        // stop as soon as the first loop is detected
        if ( fVerbose )
        Abc_Print( 1, " CO %d\n", i );
        break;
    }
    return fAcyclic;
}